

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestTailCallee
          (TestInterfaceImpl *this,GetTestTailCalleeContext context)

{
  _func_int **pp_Var1;
  CapTableBuilder *pCVar2;
  ClientHook *pCVar3;
  undefined8 *puVar4;
  long *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  PointerBuilder local_98;
  SegmentBuilder *local_80;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_78;
  StructBuilder local_68;
  undefined1 local_38;
  
  local_38 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_80);
  local_98.pointer = (WirePointer *)OStack_78.ptr;
  local_98.segment = local_80;
  local_98.capTable = (CapTableBuilder *)OStack_78.disposer;
  PointerBuilder::getStruct(&local_68,&local_98,(StructSize)0x10000,(word *)0x0);
  pp_Var1 = context.hook[1]._vptr_CallContextHook;
  puVar4 = (undefined8 *)operator_new(0x20);
  local_98.capTable = (CapTableBuilder *)(puVar4 + 2);
  puVar4[3] = 0;
  *puVar4 = 0x36dc38;
  puVar4[2] = 0x36dc70;
  puVar4[1] = pp_Var1;
  local_98.segment = (SegmentBuilder *)&kj::_::HeapDisposer<capnp::_::TestTailCalleeImpl>::instance;
  OVar5 = Capability::Client::makeLocalClient
                    ((Client *)&OStack_78,
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_98);
  pCVar2 = local_98.capTable;
  if (local_98.capTable != (CapTableBuilder *)0x0) {
    local_98.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_98.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_98.segment,
               (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader,OVar5.ptr);
  }
  local_80 = (SegmentBuilder *)&capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  local_98.segment = local_68.segment;
  local_98.capTable = local_68.capTable;
  local_98.pointer = local_68.pointers;
  PointerBuilder::setCapability(&local_98,&OStack_78);
  pCVar3 = OStack_78.ptr;
  if (OStack_78.ptr != (ClientHook *)0x0) {
    OStack_78.ptr = (ClientHook *)0x0;
    (**((CapTableReader *)&(OStack_78.disposer)->_vptr_Disposer)->_vptr_CapTableReader)
              (OStack_78.disposer,
               (long)&((WireValue<uint32_t> *)&pCVar3->_vptr_ClientHook)->value +
               *(long *)(*(long *)&pCVar3->_vptr_ClientHook + -0x10));
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestTailCallee(GetTestTailCalleeContext context) {
  context.getResults().setCap(kj::heap<TestTailCalleeImpl>(callCount));
  return kj::READY_NOW;
}